

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeViewport(ImGuiViewportP *viewport)

{
  ImGuiViewportP *viewport_00;
  bool bVar1;
  char *pcVar2;
  ImDrawList **ppIVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *local_68;
  int local_4c;
  int local_48;
  int draw_list_i;
  int layer_i;
  uint local_3c;
  ImGuiViewportP *pIStack_38;
  ImGuiWindowFlags flags;
  ImGuiViewportP *viewport_local;
  
  pIStack_38 = viewport;
  SetNextItemOpen(true,2);
  if (pIStack_38->Window == (ImGuiWindow *)0x0) {
    local_68 = "N/A";
  }
  else {
    local_68 = pIStack_38->Window->Name;
  }
  bVar1 = TreeNode((void *)(ulong)(pIStack_38->super_ImGuiViewport).ID,
                   "Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"",
                   (ulong)*(uint *)&(pIStack_38->super_ImGuiViewport).field_0x5c,
                   (ulong)(pIStack_38->super_ImGuiViewport).ID,
                   (ulong)(pIStack_38->super_ImGuiViewport).ParentViewportId,local_68);
  if (bVar1) {
    local_3c = (pIStack_38->super_ImGuiViewport).Flags;
    BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%"
               ,(double)(pIStack_38->super_ImGuiViewport).Pos.x,
               (double)(pIStack_38->super_ImGuiViewport).Pos.y,
               (double)(pIStack_38->super_ImGuiViewport).Size.x,
               (double)(pIStack_38->super_ImGuiViewport).Size.y,
               (double)(pIStack_38->WorkOffsetMin).x,(double)(pIStack_38->WorkOffsetMin).y,
               (double)(pIStack_38->WorkOffsetMax).x,(double)(pIStack_38->WorkOffsetMax).y,
               (ulong)(uint)(int)pIStack_38->PlatformMonitor);
    if (0 < *(int *)&(pIStack_38->super_ImGuiViewport).field_0x5c) {
      SameLine(0.0,-1.0);
      bVar1 = SmallButton("Reset Pos");
      if (bVar1) {
        ImVec2::ImVec2((ImVec2 *)&draw_list_i,200.0,200.0);
        (pIStack_38->super_ImGuiViewport).Pos = _draw_list_i;
        ImGuiViewportP::UpdateWorkRect(pIStack_38);
        if (pIStack_38->Window != (ImGuiWindow *)0x0) {
          pIStack_38->Window->Pos = (pIStack_38->super_ImGuiViewport).Pos;
        }
      }
    }
    pcVar5 = "";
    if ((local_3c & 2) != 0) {
      pcVar5 = " IsPlatformMonitor";
    }
    pcVar4 = "";
    if ((local_3c & 4) != 0) {
      pcVar4 = " OwnedByApp";
    }
    pcVar7 = "";
    if ((local_3c & 8) != 0) {
      pcVar7 = " NoDecoration";
    }
    pcVar8 = "";
    if ((local_3c & 0x10) != 0) {
      pcVar8 = " NoTaskBarIcon";
    }
    pcVar12 = "";
    if ((local_3c & 0x20) != 0) {
      pcVar12 = " NoFocusOnAppearing";
    }
    pcVar11 = "";
    if ((local_3c & 0x40) != 0) {
      pcVar11 = " NoFocusOnClick";
    }
    pcVar14 = "";
    if ((local_3c & 0x80) != 0) {
      pcVar14 = " NoInputs";
    }
    pcVar13 = "";
    if ((local_3c & 0x100) != 0) {
      pcVar13 = " NoRendererClear";
    }
    pcVar6 = "";
    if ((local_3c & 0x200) != 0) {
      pcVar6 = " TopMost";
    }
    pcVar10 = "";
    if ((local_3c & 0x400) != 0) {
      pcVar10 = " Minimized";
    }
    pcVar9 = "";
    if ((local_3c & 0x800) != 0) {
      pcVar9 = " NoAutoMerge";
    }
    pcVar2 = "";
    if ((local_3c & 0x1000) != 0) {
      pcVar2 = " CanHostOtherWindows";
    }
    BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s%s%s%s%s%s",
               (ulong)(uint)(pIStack_38->super_ImGuiViewport).Flags,pcVar5,pcVar4,pcVar7,pcVar8,
               pcVar12,pcVar11,pcVar14,pcVar13,pcVar6,pcVar10,pcVar9,pcVar2);
    for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
      for (local_4c = 0; viewport_00 = pIStack_38,
          local_4c < (pIStack_38->DrawDataBuilder).Layers[local_48].Size; local_4c = local_4c + 1) {
        ppIVar3 = ImVector<ImDrawList_*>::operator[]
                            ((pIStack_38->DrawDataBuilder).Layers + local_48,local_4c);
        DebugNodeDrawList((ImGuiWindow *)0x0,viewport_00,*ppIVar3,"DrawList");
      }
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeViewport(ImGuiViewportP* viewport)
{
    SetNextItemOpen(true, ImGuiCond_Once);
    if (TreeNode((void*)(intptr_t)viewport->ID, "Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"", viewport->Idx, viewport->ID, viewport->ParentViewportId, viewport->Window ? viewport->Window->Name : "N/A"))
    {
        ImGuiWindowFlags flags = viewport->Flags;
        BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%",
            viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
            viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y,
            viewport->PlatformMonitor, viewport->DpiScale * 100.0f);
        if (viewport->Idx > 0) { SameLine(); if (SmallButton("Reset Pos")) { viewport->Pos = ImVec2(200, 200); viewport->UpdateWorkRect(); if (viewport->Window) viewport->Window->Pos = viewport->Pos; } }
        BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s%s%s%s%s%s", viewport->Flags,
            //(flags & ImGuiViewportFlags_IsPlatformWindow) ? " IsPlatformWindow" : "", // Omitting because it is the standard
            (flags & ImGuiViewportFlags_IsPlatformMonitor) ? " IsPlatformMonitor" : "",
            (flags & ImGuiViewportFlags_OwnedByApp) ? " OwnedByApp" : "",
            (flags & ImGuiViewportFlags_NoDecoration) ? " NoDecoration" : "",
            (flags & ImGuiViewportFlags_NoTaskBarIcon) ? " NoTaskBarIcon" : "",
            (flags & ImGuiViewportFlags_NoFocusOnAppearing) ? " NoFocusOnAppearing" : "",
            (flags & ImGuiViewportFlags_NoFocusOnClick) ? " NoFocusOnClick" : "",
            (flags & ImGuiViewportFlags_NoInputs) ? " NoInputs" : "",
            (flags & ImGuiViewportFlags_NoRendererClear) ? " NoRendererClear" : "",
            (flags & ImGuiViewportFlags_TopMost) ? " TopMost" : "",
            (flags & ImGuiViewportFlags_Minimized) ? " Minimized" : "",
            (flags & ImGuiViewportFlags_NoAutoMerge) ? " NoAutoMerge" : "",
            (flags & ImGuiViewportFlags_CanHostOtherWindows) ? " CanHostOtherWindows" : "");
        for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
            for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                DebugNodeDrawList(NULL, viewport, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        TreePop();
    }
}